

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::Unwind<false>
          (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *this,
          CordRepBtree *tree,int depth,size_t length,OpResult result)

{
  uint uVar1;
  long lVar2;
  CordRepBtree *pCVar3;
  size_t sVar4;
  OpResult OVar5;
  OpResult OVar6;
  CordRepBtree *pCStack_48;
  bool owned;
  CordRepBtree *node;
  size_t length_local;
  int depth_local;
  CordRepBtree *tree_local;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *this_local;
  OpResult result_local;
  
  this_local = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
               result.tree;
  result_local.tree = (CordRepBtree *)(ulong)result.action;
  sVar4 = length;
  length_local._4_4_ = depth;
  if (depth != 0) {
    do {
      lVar2 = (long)length_local._4_4_;
      length_local._4_4_ = length_local._4_4_ + -1;
      pCStack_48 = this->stack[lVar2 + -1];
      uVar1 = this->share_depth;
      sVar4 = (size_t)uVar1;
      if ((int)result_local.tree == 0) {
        (pCStack_48->super_CordRep).length = length + (pCStack_48->super_CordRep).length;
        while (0 < length_local._4_4_) {
          length_local._4_4_ = length_local._4_4_ + -1;
          pCStack_48 = this->stack[length_local._4_4_];
          (pCStack_48->super_CordRep).length = length + (pCStack_48->super_CordRep).length;
        }
        return pCStack_48;
      }
      if ((int)result_local.tree == 1) {
        sVar4 = length;
        OVar6 = CordRepBtree::SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                          (pCStack_48,length_local._4_4_ < (int)uVar1,(CordRep *)this_local,length);
        this_local = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                      *)OVar6.tree;
        result_local.tree = (CordRepBtree *)(ulong)OVar6.action;
      }
      else if ((int)result_local.tree == 2) {
        sVar4 = length;
        OVar5 = CordRepBtree::AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                          (pCStack_48,length_local._4_4_ < (int)uVar1,(CordRep *)this_local,length);
        this_local = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                      *)OVar5.tree;
        result_local.tree = (CordRepBtree *)(ulong)OVar5.action;
      }
    } while (0 < length_local._4_4_);
  }
  OVar5._8_8_ = sVar4;
  OVar5.tree = result_local.tree;
  pCVar3 = Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )tree,(CordRepBtree *)this_local,OVar5);
  return pCVar3;
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }